

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int RGBColorMatrix(uint8_t *dst_argb,int dst_stride_argb,int8_t *matrix_rgb,int dst_x,int dst_y,
                  int width,int height)

{
  int iVar1;
  ushort uVar2;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int8_t matrix_argb [16];
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 uVar3;
  undefined6 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [14];
  undefined1 auVar9 [16];
  
  iVar1 = -1;
  if ((((-1 < (dst_y | dst_x)) && (dst_argb != (uint8_t *)0x0)) && (matrix_rgb != (int8_t *)0x0)) &&
     ((0 < width && (0 < height)))) {
    uVar5 = *(undefined8 *)matrix_rgb;
    auVar8._0_2_ = (ushort)uVar5 >> 7;
    auVar8._2_2_ = (ushort)((ulong)uVar5 >> 0x10) >> 7;
    auVar8._4_2_ = (ushort)((ulong)uVar5 >> 0x20) >> 7;
    auVar8._6_2_ = (ushort)((ulong)uVar5 >> 0x37);
    auVar8._8_8_ = 0;
    auVar8 = auVar8 & _DAT_004301a0;
    uVar2 = CONCAT11(auVar8[1] + (char)((ulong)uVar5 >> 8),auVar8[0] + (char)uVar5);
    uVar3 = CONCAT13(auVar8[3] + (char)((ulong)uVar5 >> 0x18),
                     CONCAT12(auVar8[2] + (char)((ulong)uVar5 >> 0x10),uVar2));
    uVar4 = CONCAT15(auVar8[5] + (char)((ulong)uVar5 >> 0x28),
                     CONCAT14(auVar8[4] + (char)((ulong)uVar5 >> 0x20),uVar3));
    uVar5 = CONCAT17(auVar8[7] + (char)((ulong)uVar5 >> 0x38),
                     CONCAT16(auVar8[6] + (char)((ulong)uVar5 >> 0x30),uVar4));
    auVar6._0_10_ = CONCAT19(auVar8[9],CONCAT18(auVar8[8],uVar5));
    auVar6[10] = auVar8[10];
    auVar6[0xb] = auVar8[0xb];
    auVar7[0xc] = auVar8[0xc];
    auVar7._0_12_ = auVar6;
    auVar7[0xd] = auVar8[0xd];
    auVar9[0xe] = auVar8[0xe];
    auVar9[0xf] = auVar8[0xf];
    auVar9._0_14_ = auVar7;
    auVar10._0_2_ = uVar2 >> 1;
    auVar10._2_2_ = (ushort)((uint)uVar3 >> 0x11);
    auVar10._4_2_ = (ushort)((uint6)uVar4 >> 0x21);
    auVar10._6_2_ = (ushort)((ulong)uVar5 >> 0x31);
    auVar10._8_2_ = (ushort)((unkuint10)auVar6._0_10_ >> 0x41);
    auVar10._10_2_ = auVar6._10_2_ >> 1;
    auVar10._12_2_ = auVar7._12_2_ >> 1;
    auVar10._14_2_ = auVar9._14_2_ >> 1;
    auVar8 = auVar10 & _DAT_004301b0 ^ _DAT_004301c0;
    local_40 = CONCAT17(auVar8[7] - DAT_004301c0._7_1_,
                        CONCAT16(auVar8[6] - DAT_004301c0._6_1_,
                                 CONCAT15(auVar8[5] - DAT_004301c0._5_1_,
                                          CONCAT14(auVar8[4] - DAT_004301c0._4_1_,
                                                   CONCAT13(auVar8[3] - DAT_004301c0._3_1_,
                                                            CONCAT12(auVar8[2] - DAT_004301c0._2_1_,
                                                                     CONCAT11(auVar8[1] -
                                                                              DAT_004301c0._1_1_,
                                                                              auVar8[0] -
                                                                              DAT_004301c0)))))));
    uVar3 = *(undefined4 *)(matrix_rgb + 8);
    auVar8 = ZEXT416(CONCAT22((ushort)((uint)uVar3 >> 0x17),(ushort)uVar3 >> 7)) & _DAT_004301a0;
    uVar2 = CONCAT11(auVar8[1] + (char)((uint)uVar3 >> 8),auVar8[0] + (char)uVar3);
    auVar11._0_2_ = uVar2 >> 1;
    auVar11._2_2_ =
         (ushort)(CONCAT13(auVar8[3] + (char)((uint)uVar3 >> 0x18),
                           CONCAT12(auVar8[2] + (char)((uint)uVar3 >> 0x10),uVar2)) >> 0x11);
    auVar11._4_4_ = 0;
    auVar11._8_2_ = auVar8._8_2_ >> 1;
    auVar11._10_2_ = auVar8._10_2_ >> 1;
    auVar11._12_2_ = auVar8._12_2_ >> 1;
    auVar11._14_2_ = auVar8._14_2_ >> 1;
    auVar8 = auVar11 & _DAT_004301b0 ^ _DAT_004301c0;
    local_38 = CONCAT13(auVar8[3] - DAT_004301c0._3_1_,
                        CONCAT12(auVar8[2] - DAT_004301c0._2_1_,
                                 CONCAT11(auVar8[1] - DAT_004301c0._1_1_,auVar8[0] - DAT_004301c0)))
    ;
    local_34 = 0x40000000;
    iVar1 = ARGBColorMatrix(dst_argb + (long)(dst_y * dst_stride_argb) + (long)(dst_x << 2),
                            dst_stride_argb,
                            dst_argb + (long)(dst_y * dst_stride_argb) + (long)(dst_x << 2),
                            dst_stride_argb,(int8_t *)&local_40,width,height);
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int RGBColorMatrix(uint8_t* dst_argb,
                   int dst_stride_argb,
                   const int8_t* matrix_rgb,
                   int dst_x,
                   int dst_y,
                   int width,
                   int height) {
  SIMD_ALIGNED(int8_t matrix_argb[16]);
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || !matrix_rgb || width <= 0 || height <= 0 || dst_x < 0 ||
      dst_y < 0) {
    return -1;
  }

  // Convert 4x3 7 bit matrix to 4x4 6 bit matrix.
  matrix_argb[0] = matrix_rgb[0] / 2;
  matrix_argb[1] = matrix_rgb[1] / 2;
  matrix_argb[2] = matrix_rgb[2] / 2;
  matrix_argb[3] = matrix_rgb[3] / 2;
  matrix_argb[4] = matrix_rgb[4] / 2;
  matrix_argb[5] = matrix_rgb[5] / 2;
  matrix_argb[6] = matrix_rgb[6] / 2;
  matrix_argb[7] = matrix_rgb[7] / 2;
  matrix_argb[8] = matrix_rgb[8] / 2;
  matrix_argb[9] = matrix_rgb[9] / 2;
  matrix_argb[10] = matrix_rgb[10] / 2;
  matrix_argb[11] = matrix_rgb[11] / 2;
  matrix_argb[14] = matrix_argb[13] = matrix_argb[12] = 0;
  matrix_argb[15] = 64;  // 1.0

  return ARGBColorMatrix((const uint8_t*)(dst), dst_stride_argb, dst,
                         dst_stride_argb, &matrix_argb[0], width, height);
}